

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O0

int b_shift(lua_State *L,lua_Unsigned r,lua_Integer i)

{
  lua_Integer i_local;
  lua_Unsigned r_local;
  lua_State *L_local;
  
  if (i < 0) {
    if (-i < 0x20) {
      i_local = (r & 0xffffffff) >> ((byte)-i & 0x3f);
    }
    else {
      i_local = 0;
    }
  }
  else {
    if (i < 0x20) {
      i_local = r << ((byte)i & 0x3f);
    }
    else {
      i_local = 0;
    }
    i_local = i_local & 0xffffffff;
  }
  lua_pushinteger(L,i_local);
  return 1;
}

Assistant:

static int b_shift (lua_State *L, lua_Unsigned r, lua_Integer i) {
  if (i < 0) {  /* shift right? */
    i = -i;
    r = trim(r);
    if (i >= LUA_NBITS) r = 0;
    else r >>= i;
  }
  else {  /* shift left */
    if (i >= LUA_NBITS) r = 0;
    else r <<= i;
    r = trim(r);
  }
  pushunsigned(L, r);
  return 1;
}